

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O1

JavascriptBigInt * Js::JavascriptBigInt::MulAbsolute(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  ScriptContext *scriptContext;
  unsigned_long *puVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  JavascriptBigInt *pJVar5;
  undefined4 *puVar6;
  Type TVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  digit_t length;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long local_58;
  ulong local_48;
  
  length = pbi2->m_length + pbi1->m_length;
  scriptContext =
       (((((pbi1->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  if (length >> 0x3d != 0) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5fff3,L"Multiply BigInt");
  }
  pJVar5 = CreateZeroWithLength(length,scriptContext);
  if (pbi1->m_length != 0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar8 = -1;
    local_58 = 0;
    lVar11 = 0;
    local_48 = 0;
    do {
      if (pbi2->m_length == 0) {
        uVar18 = 0;
      }
      else {
        uVar19 = 0;
        uVar18 = 0;
        do {
          puVar1 = (pJVar5->m_digits).ptr;
          uVar2 = *(ulong *)((long)puVar1 + uVar19 * 8 + local_58);
          *(ulong *)((long)puVar1 + uVar19 * 8 + local_58) = uVar18 + uVar2;
          uVar14 = (pbi1->m_digits).ptr[local_48];
          uVar13 = (pbi2->m_digits).ptr[uVar19];
          uVar9 = uVar14 & 0xffffffff;
          uVar14 = uVar14 >> 0x20;
          uVar10 = uVar13 & 0xffffffff;
          uVar13 = uVar13 >> 0x20;
          uVar16 = uVar10 * uVar9;
          uVar9 = uVar9 * uVar13;
          uVar10 = uVar10 * uVar14;
          uVar17 = uVar9 << 0x20;
          uVar15 = ((ulong)(uint)((int)uVar9 + (int)uVar10) << 0x20) + uVar16;
          uVar12 = (ulong)CARRY8(uVar17,uVar16) + 1;
          if (uVar17 + uVar16 <= uVar15) {
            uVar12 = (ulong)CARRY8(uVar17,uVar16);
          }
          lVar11 = (uVar10 >> 0x20) + uVar13 * uVar14 + (uVar9 >> 0x20);
          uVar14 = lVar11 + uVar12 + (ulong)CARRY8(uVar18,uVar2);
          uVar12 = lVar11 + uVar12;
          *(ulong *)((long)puVar1 + uVar19 * 8 + local_58) = uVar18 + uVar2 + uVar15;
          if (uVar14 < uVar12) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                        ,0x250,"(overflow == 0)","overflow == 0");
            if (!bVar4) goto LAB_00d3247f;
            *puVar6 = 0;
          }
          uVar18 = CARRY8(uVar18 + uVar2,uVar15) + uVar14;
          if ((uVar14 < uVar12) || (uVar18 < uVar14)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                        ,0x252,"(overflow == 0)","overflow == 0");
            if (!bVar4) goto LAB_00d3247f;
            *puVar6 = 0;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < pbi2->m_length);
        lVar11 = uVar19 + lVar8;
      }
      if (uVar18 != 0) {
        (pJVar5->m_digits).ptr[lVar11 + 1] = uVar18;
      }
      local_48 = local_48 + 1;
      lVar8 = lVar8 + 1;
      local_58 = local_58 + 8;
    } while (local_48 < pbi1->m_length);
  }
  TVar7 = pJVar5->m_length;
  bVar4 = TVar7 == 0;
  if (!bVar4) {
    puVar1 = (pJVar5->m_digits).ptr;
    if (puVar1[TVar7 - 1] == 0) {
      TVar7 = TVar7 - 1;
      do {
        pJVar5->m_length = TVar7;
        bVar4 = TVar7 == 0;
        TVar7 = TVar7 - 1;
        if (bVar4) goto LAB_00d3241b;
      } while (puVar1[TVar7] == 0);
    }
    if (!bVar4) {
      return pJVar5;
    }
  }
LAB_00d3241b:
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar6 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                              ,0x25f,"(pbi3->m_length > 0)","pbi3->m_length > 0");
  if (bVar4) {
    *puVar6 = 0;
    return pJVar5;
  }
LAB_00d3247f:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

JavascriptBigInt * JavascriptBigInt::MulAbsolute(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        // Start with maximum length possible in pbi3
        digit_t length = pbi1->m_length + pbi2->m_length;
        if (SIZE_MAX / sizeof(digit_t) < length) // overflow 
        {
            JavascriptError::ThrowRangeError(pbi1->GetScriptContext(), VBSERR_TypeMismatch, _u("Multiply BigInt"));
        }
        JavascriptBigInt * pbi3 = JavascriptBigInt::CreateZeroWithLength(length, pbi1->GetScriptContext());

        // Compute pbi3 = pbi1 * pbi2 as follow:
        // e.g. A1 A0 * B1 B0 = C3 C2 C1 C0
        // C0 = A0 * B0 (take the digit and carry)
        // C1 = carry + A0 * B1 + A1 * B0 (take the digit and carry)
        // C2 = carry + A1 * B1 (take the digit and carry)
        // C3 = carry
        digit_t carryDigit = 0;
        digit_t i3 = 0;

        for (digit_t i1 = 0; i1 < pbi1->m_length; i1++)
        {
            carryDigit = 0;
            for (digit_t i2 = 0; i2 < pbi2->m_length; i2++)
            {
                i3 = i1 + i2;
                digit_t tempCarryDigit1 = 0;
                digit_t tempCarryDigit2 = 0;
                pbi3->m_digits[i3] = JavascriptBigInt::AddDigit(pbi3->m_digits[i3], carryDigit, &tempCarryDigit1);
                digit_t mulDigitResult = JavascriptBigInt::MulDigit(pbi1->m_digits[i1], pbi2->m_digits[i2], &carryDigit);
                pbi3->m_digits[i3] = JavascriptBigInt::AddDigit(pbi3->m_digits[i3], mulDigitResult, &tempCarryDigit2);
                digit_t overflow = 0;
                carryDigit = JavascriptBigInt::AddDigit(carryDigit, tempCarryDigit1, &overflow);
                Assert(overflow == 0); // [i1] * [i2] can not carry through [i1+i2+2]
                carryDigit = JavascriptBigInt::AddDigit(carryDigit, tempCarryDigit2, &overflow);
                Assert(overflow == 0); // [i1] * [i2] can not carry through [i1+i2+2]
            }
            if (carryDigit > 0)
            {
                pbi3->m_digits[i3 + 1] = carryDigit;
            }
        }
        
        // adjust length
        while ((pbi3->m_length > 0) && (pbi3->m_digits[pbi3->m_length - 1] == 0))
        {
            pbi3->m_length--;
        }
        Assert(pbi3->m_length > 0);
        return pbi3;
    }